

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shortest-paths.hxx
# Opt level: O2

void andres::graph::graph_detail::spspHelper<unsigned_long>
               (vector<long,_std::allocator<long>_> *parents,unsigned_long vPositive,
               unsigned_long vNegative,deque<unsigned_long,_std::allocator<unsigned_long>_> *path)

{
  ulong uVar1;
  unsigned_long local_28;
  
  do {
    local_28 = vPositive;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_front(path,&local_28);
    vPositive = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start[local_28] - 1;
  } while (vPositive != local_28);
  do {
    local_28 = vNegative;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(path,&local_28);
    uVar1 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_start[local_28];
    vNegative = ~uVar1;
  } while ((local_28 ^ uVar1) != 0xffffffffffffffff);
  return;
}

Assistant:

inline void
spspHelper(
    const std::vector<std::ptrdiff_t>& parents,
    const T vPositive,
    const T vNegative,
    std::deque<T>& path
) {
    assert(vPositive >= 0);
    assert(vNegative >= 0);
    T t = vPositive;
    for(;;) {
        path.push_front(t);
        if(parents[t] - 1 == t) {
            break;
        }
        else {
            t = parents[t] - 1;
        }
    }
    t = vNegative;
    for(;;) {
        path.push_back(t);
        if(-parents[t] - 1 == t) {
            break;
        }
        else {
            t = -parents[t] - 1;
        }
    }
}